

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O3

void write_cptr(int coff,int clen,opj_cio_t *cio)

{
  int pos;
  int pos_00;
  
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x63707472,4);
  cio_write(cio,0,2);
  cio_write(cio,0,2);
  cio_write(cio,(long)coff,8);
  cio_write(cio,(long)clen,8);
  pos_00 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(pos_00 - pos),4);
  cio_seek(cio,pos_00);
  return;
}

Assistant:

void write_cptr(int coff, int clen, opj_cio_t *cio)
{
  int len, lenp;

  lenp = cio_tell( cio);
  cio_skip( cio, 4);               /* L [at the end]     */
  cio_write( cio, JPIP_CPTR, 4);   /* T                  */
  cio_write( cio, 0, 2);           /* DR  A PRECISER !!  */
  cio_write( cio, 0, 2);           /* CONT               */
  cio_write( cio, coff, 8);    /* COFF A PRECISER !! */
  cio_write( cio, clen, 8);    /* CLEN               */
  len = cio_tell( cio) - lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);         /* L                  */
  cio_seek( cio, lenp+len);
}